

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void elem_float(t_elem *x,t_float f)

{
  char *pcVar1;
  t_elem *object;
  int iVar2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  int local_68;
  int local_64;
  int type;
  int elemsize;
  _array *array;
  t_word *w;
  t_gpointer *gparent;
  t_template *elemtemplate;
  t_template *template;
  t_symbol *elemtemplatesym;
  t_symbol *fieldsym;
  t_symbol *templatesym;
  int onset;
  int nitems;
  int indx;
  t_float f_local;
  t_elem *x_local;
  
  onset = (int)f;
  elemtemplatesym = x->x_fieldsym;
  w = (t_word *)&x->x_gparent;
  nitems = (int)f;
  _indx = x;
  iVar2 = gpointer_check((t_gpointer *)w,0);
  if (iVar2 == 0) {
    pd_error(_indx,"element: empty pointer");
  }
  else {
    if (*_indx->x_templatesym->s_name == '\0') {
      fieldsym = gpointer_gettemplatesym((t_gpointer *)w);
    }
    else {
      ptVar4 = _indx->x_templatesym;
      fieldsym = ptVar4;
      ptVar3 = gpointer_gettemplatesym((t_gpointer *)w);
      object = _indx;
      if (ptVar4 != ptVar3) {
        pcVar1 = fieldsym->s_name;
        ptVar4 = gpointer_gettemplatesym((t_gpointer *)w);
        pd_error(object,"element %s: got wrong template (%s)",pcVar1,ptVar4->s_name);
        return;
      }
    }
    elemtemplate = template_findbyname(fieldsym);
    if (elemtemplate == (t_template *)0x0) {
      pd_error(_indx,"element: couldn\'t find template %s",fieldsym->s_name);
    }
    else {
      if ((w[2].w_gpointer)->gp_valid == 2) {
        array = w->w_array;
      }
      else {
        array = (_array *)&w->w_array->a_valid;
      }
      if (elemtemplate == (t_template *)0x0) {
        pd_error(_indx,"element: couldn\'t find template %s",fieldsym->s_name);
      }
      else {
        iVar2 = template_find_field(elemtemplate,elemtemplatesym,(int *)&templatesym,&local_68,
                                    (t_symbol **)&template);
        if (iVar2 == 0) {
          pd_error(_indx,"element: couldn\'t find array field %s",elemtemplatesym->s_name);
        }
        else if (local_68 == 3) {
          gparent = (t_gpointer *)template_findbyname((t_symbol *)template);
          if ((t_template *)gparent == (t_template *)0x0) {
            pd_error(_indx,"element: couldn\'t find field template %s",template->t_pdobj);
          }
          else {
            local_64 = ((t_template *)gparent)->t_n * 8;
            _type = *(_array **)((long)&array->a_n + (long)(int)templatesym);
            templatesym._4_4_ = _type->a_n;
            if (onset < 0) {
              onset = 0;
            }
            if (templatesym._4_4_ <= onset) {
              onset = templatesym._4_4_ + -1;
            }
            gpointer_setarray(&_indx->x_gp,_type,(t_word *)(_type->a_vec + onset * local_64));
            outlet_pointer((_indx->x_obj).te_outlet,&_indx->x_gp);
          }
        }
        else {
          pd_error(_indx,"element: field %s not of type array",elemtemplatesym->s_name);
        }
      }
    }
  }
  return;
}

Assistant:

static void elem_float(t_elem *x, t_float f)
{
    int indx = f, nitems, onset;
    t_symbol *templatesym, *fieldsym = x->x_fieldsym, *elemtemplatesym;
    t_template *template;
    t_template *elemtemplate;
    t_gpointer *gparent = &x->x_gparent;
    t_word *w;
    t_array *array;
    int elemsize, type;

    if (!gpointer_check(gparent, 0))
    {
        pd_error(x, "element: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) !=
            gpointer_gettemplatesym(gparent))
        {
            pd_error(x, "element %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gparent)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gparent);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "element: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (gparent->gp_stub->gs_which == GP_ARRAY) w = gparent->gp_un.gp_w;
    else w = gparent->gp_un.gp_scalar->sc_vec;
    if (!template)
    {
        pd_error(x, "element: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!template_find_field(template, fieldsym,
        &onset, &type, &elemtemplatesym))
    {
        pd_error(x, "element: couldn't find array field %s", fieldsym->s_name);
        return;
    }
    if (type != DT_ARRAY)
    {
        pd_error(x, "element: field %s not of type array", fieldsym->s_name);
        return;
    }
    if (!(elemtemplate = template_findbyname(elemtemplatesym)))
    {
        pd_error(x, "element: couldn't find field template %s",
            elemtemplatesym->s_name);
        return;
    }

    elemsize = elemtemplate->t_n * sizeof(t_word);

    array = *(t_array **)(((char *)w) + onset);

    nitems = array->a_n;
    if (indx < 0) indx = 0;
    if (indx >= nitems) indx = nitems-1;

    gpointer_setarray(&x->x_gp, array,
        (t_word *)((char *)(array->a_vec) + indx * elemsize));
    outlet_pointer(x->x_obj.ob_outlet, &x->x_gp);
}